

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O0

Instruction * __thiscall spvtools::opt::Loop::GetConditionInst(Loop *this)

{
  bool bVar1;
  Op OVar2;
  uint32_t id;
  DefUseManager *this_00;
  Loop *this_01;
  Instruction *condition_inst;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_28;
  Instruction *branch_conditional;
  BasicBlock *condition_block;
  Loop *this_local;
  
  condition_block = (BasicBlock *)this;
  branch_conditional = (Instruction *)FindConditionBlock(this);
  if ((BasicBlock *)branch_conditional == (BasicBlock *)0x0) {
    this_local = (Loop *)0x0;
  }
  else {
    BasicBlock::tail((BasicBlock *)&condition_inst);
    local_28._M_t.
    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
         (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
          )utils::IntrusiveList<spvtools::opt::Instruction>::
           iterator_template<spvtools::opt::Instruction>::operator*
                     ((iterator_template<spvtools::opt::Instruction> *)&condition_inst);
    if (((tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>)
         local_28._M_t.
         super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
         .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl ==
         (_Head_base<0UL,_spvtools::opt::Instruction_*,_false>)0x0) ||
       (OVar2 = opt::Instruction::opcode
                          ((Instruction *)
                           local_28._M_t.
                           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl)
       , OVar2 != OpBranchConditional)) {
      this_local = (Loop *)0x0;
    }
    else {
      this_00 = IRContext::get_def_use_mgr(this->context_);
      id = opt::Instruction::GetSingleWordInOperand
                     ((Instruction *)
                      local_28._M_t.
                      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,0);
      this_01 = (Loop *)analysis::DefUseManager::GetDef(this_00,id);
      OVar2 = opt::Instruction::opcode((Instruction *)this_01);
      bVar1 = IsSupportedCondition(this,OVar2);
      this_local = this_01;
      if (!bVar1) {
        this_local = (Loop *)0x0;
      }
    }
  }
  return (Instruction *)this_local;
}

Assistant:

Instruction* Loop::GetConditionInst() const {
  BasicBlock* condition_block = FindConditionBlock();
  if (!condition_block) {
    return nullptr;
  }
  Instruction* branch_conditional = &*condition_block->tail();
  if (!branch_conditional ||
      branch_conditional->opcode() != spv::Op::OpBranchConditional) {
    return nullptr;
  }
  Instruction* condition_inst = context_->get_def_use_mgr()->GetDef(
      branch_conditional->GetSingleWordInOperand(0));
  if (IsSupportedCondition(condition_inst->opcode())) {
    return condition_inst;
  }

  return nullptr;
}